

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcompress.c
# Opt level: O3

int compress2file_from_mem
              (char *inmemptr,size_t inmemsize,FILE *outdiskfile,size_t *filesize,int *status)

{
  int iVar1;
  void *__ptr;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  z_stream c_stream;
  char *local_a0;
  int local_98;
  void *local_88;
  int local_80;
  size_t local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  
  if (0 < *status) {
    return *status;
  }
  __ptr = malloc(0x1c200);
  if (__ptr == (void *)0x0) {
    *status = 0x71;
    iVar1 = 0x71;
  }
  else {
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    iVar1 = deflateInit2_(&local_a0,1,8,0x1f,8,0,"1.2.11",0x70);
    if (iVar1 == 0) {
      if (inmemsize == 0) {
        uVar4 = 1;
      }
      else {
        uVar4 = (inmemsize - 1) / 0xffffffff + 1;
      }
      uVar5 = 0;
      do {
        lVar2 = (uVar5 << 0x20) - uVar5;
        local_a0 = inmemptr + lVar2;
        local_98 = (int)inmemsize - (int)lVar2;
        if (uVar5 != uVar4 - 1) {
          local_98 = -1;
        }
        do {
          local_80 = 0x1c200;
          local_88 = __ptr;
          iVar1 = deflate(&local_a0,(ulong)(uVar4 - 1 <= uVar5) << 2);
          if (iVar1 == -2) {
LAB_001c317d:
            deflateEnd(&local_a0);
            free(__ptr);
            goto LAB_001c318f;
          }
          if (local_80 == 0x1c200) break;
          uVar6 = 0x1c200 - local_80;
          sVar3 = fwrite(__ptr,1,(ulong)uVar6,(FILE *)outdiskfile);
          if (sVar3 != uVar6) goto LAB_001c317d;
        } while (local_80 == 0);
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar4);
      free(__ptr);
      if (filesize != (size_t *)0x0) {
        *filesize = local_78;
      }
      iVar1 = deflateEnd(&local_a0);
      if (iVar1 == 0) {
        return *status;
      }
    }
LAB_001c318f:
    *status = 0x19d;
    iVar1 = 0x19d;
  }
  return iVar1;
}

Assistant:

int compress2file_from_mem(                                                
             char *inmemptr,     /* I - memory pointer to uncompressed bytes */
             size_t inmemsize,   /* I - size of input uncompressed file      */
             FILE *outdiskfile, 
             size_t *filesize,   /* O - size of file, in bytes              */
             int *status)

/*
  Compress the memory file into disk file. 
*/
{
    int err, flushflag;
    char  *outfilebuff;
    uLong nPages=1, iPage=0;
    uInt nBytesToFile=0;
    z_stream c_stream;  /* compression stream */

    if (*status > 0)
        return(*status);
    
    /* Allocate buffer to hold compressed bytes */
    outfilebuff = (char*)malloc(GZBUFSIZE);
    if (!outfilebuff) return(*status = 113); /* memory error */

    c_stream.zalloc = (alloc_func)0;
    c_stream.zfree = (free_func)0;
    c_stream.opaque = (voidpf)0;

    /* Initialize the compression.  The argument (15+16) tells the 
       compressor that we are to use the gzip algorythm.
       Also use Z_BEST_SPEED for maximum speed with very minor loss
       in compression factor. */
    err = deflateInit2(&c_stream, Z_BEST_SPEED, Z_DEFLATED,
                       (15+16), 8, Z_DEFAULT_STRATEGY);

    if (err != Z_OK) return(*status = 413);

    if (inmemsize > 0)
       nPages = 1 + (uLong)(inmemsize-1)/(uLong)UINT_MAX;

    for (iPage=0; iPage<nPages; ++iPage)
    {
       c_stream.next_in = (unsigned char*)inmemptr + iPage*UINT_MAX;
       c_stream.avail_in = (iPage == nPages-1) ? 
                  inmemsize - iPage*UINT_MAX : UINT_MAX;
       
       flushflag = (iPage < nPages-1) ? Z_NO_FLUSH : Z_FINISH; 
       do {
           c_stream.next_out = (unsigned char*) outfilebuff;
           c_stream.avail_out = GZBUFSIZE;
           
           /* compress as much of the input as will fit in the output */
           err = deflate(&c_stream, flushflag);

           if (err == Z_STREAM_ERROR)
           {
               deflateEnd(&c_stream);
               free(outfilebuff);
               return(*status = 413);
           }
           else
           {
              /* c_stream.avail_out will be 0 unless we've reached the end of the avail_in 
                 stream.  When that happens avail_out MAY also be 0, if by chance the output
                 buffer fills up just as the input stream ends.  That's OK though, as it will
                 execute just one more do/while where the deflate call won't actually do
                 anything.  */
              nBytesToFile = GZBUFSIZE - c_stream.avail_out;
              if (nBytesToFile)
              {
                 if (fwrite(outfilebuff, 1, nBytesToFile, outdiskfile) != nBytesToFile)
                 {
                    deflateEnd(&c_stream);
                    free(outfilebuff);
                    return(*status = 413);                 
                 }
              }
           }
        } while (c_stream.avail_out == 0);

    }

    free(outfilebuff); /* free temporary output data buffer */

    /* Set the output file size to be the total output data */
    if (filesize) *filesize = c_stream.total_out;

    /* End the compression */
    err = deflateEnd(&c_stream);

    if (err != Z_OK) return(*status = 413);
     
    return(*status);
}